

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::~DeferredThirdPartyClient
          (DeferredThirdPartyClient *this)

{
  ~DeferredThirdPartyClient((DeferredThirdPartyClient *)((long)&this[-1].state.field_1 + 0x18));
  return;
}

Assistant:

class DeferredThirdPartyClient: public RpcClient {
    // Client constructed from a ThirdPartyCapDescriptor which we have not actually accepted yet.
    // We don't actually attempt to send an `Accept` message to the third party until the
    // application attempts to use the capability. This way, if we merely end up forwarding the
    // cap to another party without using it at all, we don't need to form our own connection to
    // the host of the capability.

  public:
    DeferredThirdPartyClient(RpcConnectionState& connectionState,
        kj::Own<AnyPointer::Reader> contact, kj::Own<RpcClient> vine)
        : RpcClient(connectionState), state(Deferred {kj::mv(contact), kj::mv(vine)}) {}

    void promiseResolvedToThis(bool receivedCall) override {
      if (receivedCall) {
        // A promise resolved to us, and it had received calls that were pipelined. If we end up
        // accepting this capability locally, we will need to use an embargo.
        needEmbargo = true;

        // promiseResolvedToThis() is always called immediately after the resolution capability was
        // received off the wire, so there should not have been a chance for it to have been
        // accepted yet. This is good, because we need to make sure we embargo it on accept.
        //
        // Note that we know for sure that the resolution message could only have created a new
        // `DeferredThirdPartyClient` -- not referred to an existing one -- because:
        // - If the type was `senderHosted` or `senderPromise`, it refers to an import, and we
        //   never place `DeferredThirdPartyClient` directly on the import table. (Its vine is on
        //   the import table, but the `DeferredThirdPartyClient` object itself is not.)
        // - If the type was `receiverHosted` or `receiverAnswer` then promiseResolvedToThis()
        //   would not have been called on it, because `unwrapIfSameConnection()` would have
        //   returned kj::none.
        // - Therefore the only possibility is that the resolve message contained a
        //   `ThirdPartyCapDescriptor`, which casued a fresh `DeferredThirdPartyClient` to be
        //   created.
        //
        // It's good that this all works out, because otherwise we'd probably need to change the
        // embargo protocol so that an embargo could be established *after* accepting the
        // capability.
        KJ_ASSERT(state.is<Deferred>());
      }
    }

    WriteDescriptorResult writeDescriptor(rpc::CapDescriptor::Builder descriptor,
                                          kj::Vector<int>& fds) override {
      KJ_SWITCH_ONEOF(state) {
        KJ_CASE_ONEOF(deferred, Deferred) {
          // A ThirdPartyCapDescriptor was sent to us, and we are sending it *back* over the same
          // connection we received it from.
          //
          // The easiest way to handle this is to send back the vine, which after all points to
          // the capability that the other side originally sent us.
          return deferred.vine->writeDescriptor(descriptor, fds);
        }
        KJ_CASE_ONEOF(cap, kj::Own<ClientHook>) {
          return connectionState->writeDescriptor(*cap, descriptor, fds);
        }
      }
      KJ_UNREACHABLE;
    }

    kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      // Someone is addressing a message to this capability. We probably need to accept it and
      // have them address the accepted capability instead.
      return connectionState->writeTarget(ensureAccepted(), target);
    }

    // NOTE: We don't need to implement adoptFlowController() since flow controllers are tied to
    //   specific connections, so presumably the old flow controller won't be able to be adopted
    //   by the new capability on the new connection anyway. Additionally, it just makes sense to
    //   recompute the flow from scratch since the new connection probably has different latency
    //   and throughput.

    WriteThirdPartyDescriptorResult writeThirdPartyDescriptor(
          VatNetworkBase::Connection& provider,
          VatNetworkBase::Connection& recipient,
          AnyPointer::Builder contact) override {
      if (state.is<Deferred>() &&
          provider.canForwardThirdPartyToContact(*state.get<Deferred>().contact, recipient)) {
        // We have not accepted this capability yet, and the VatNetwork supports forwarding it!
        // We can get away without accepting the capability.
        auto& deferred = state.get<Deferred>();
        provider.forwardThirdPartyToContact(*deferred.contact, recipient, contact);

        return VineToExport {
          .vine = deferred.vine->addRef(),
          .vineInfo = kj::heap(VineInfo {.info = capnp::clone(*deferred.contact)}),
        };
      } else {
        // Either:
        // a. We already accepted this cap, so we should treat this as a normal three-party handoff
        //    and hand off the cap we accepted. (Actually, this doesn't happen in practice because
        //    the caller would already have resolved to the inner capability in this case.)
        // b. The VatNetwork won't allow forwarding, so we must accept the cap first, and then,
        //    again, hand off the accepted cap.
        auto& hook = ensureAccepted();
        KJ_IF_SOME(rpcHook, connectionState->unwrapIfSameNetwork(hook)) {
          KJ_SWITCH_ONEOF(rpcHook.connectionState->connection) {
            KJ_CASE_ONEOF(connected, Connected) {
              // Common case: the accepted capability is on its own connection, which we're still
              // connected to.
              return rpcHook.writeThirdPartyDescriptor(*connected.connection, recipient, contact);
            }
            KJ_CASE_ONEOF(error, Disconnected) {
              // We accepted the capability but the connection we accepted it on is now dead.
              // Don't fill in `contact` and just return a broken cap.
              return newBrokenCap(kj::cp(error));
            }
          }
          KJ_UNREACHABLE;
        } else {
          // Apparently, when we accepted the capability, it turned out to be a self-introduction
          // and now we're left with a capability pointing into our own vat. We need to return
          // that instead.
          return hook.addRef();
        }
      }
    }

    // implements ClientHook -----------------------------------------

    Request<AnyPointer, AnyPointer> newCall(
        uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
        CallHints hints) override {
      // If we receive a call, then we should immediately accept the capability in order to
      // dispatch it. (Note that if we didn't override this, then writeTarget() would eventually
      // be called and would accept the capability there, but at that point we've already
      // constructed the requst and would have to redirect it, requiring a copy.)
      return ensureAccepted().newCall(interfaceId, methodId, sizeHint, hints);
    }